

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O1

CURLcode canon_string(char *q,size_t len,dynbuf *dq,_Bool *found_equals)

{
  byte bVar1;
  ulong uVar2;
  char cVar3;
  uint uVar4;
  CURLcode CVar5;
  ulong in_RAX;
  size_t len_00;
  byte *mem;
  char tmp [3];
  uchar out [3];
  undefined8 local_38;
  
  if (len == 0) {
    return CURLE_OK;
  }
  local_38 = in_RAX;
  do {
    bVar1 = *q;
    if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
LAB_0013d1b2:
      len_00 = 1;
      mem = (byte *)q;
LAB_0013d1bd:
      CVar5 = Curl_dyn_addn(dq,mem,len_00);
    }
    else {
      if (0x5e < bVar1) {
        if ((bVar1 == 0x7e) || (bVar1 == 0x5f)) goto LAB_0013d1b2;
LAB_0013d1d4:
        uVar2 = local_38 >> 0x30;
        local_38._0_6_ = CONCAT24(0x25,(undefined4)local_38);
        local_38 = CONCAT26((short)uVar2,(undefined6)local_38) & 0xff00ffffffffffff;
        if (found_equals == (_Bool *)0x0) {
          if (*q == 0x2f) goto LAB_0013d1b2;
        }
        else if (*q == 0x3d) {
          CVar5 = Curl_dyn_addn(dq,q,1);
          *found_equals = true;
          goto LAB_0013d1c2;
        }
        Curl_hexbyte((uchar *)((long)&local_38 + 5),*q,false);
        len_00 = 3;
        mem = (byte *)((long)&local_38 + 4);
        goto LAB_0013d1bd;
      }
      if (bVar1 - 0x2d < 2) goto LAB_0013d1b2;
      if (bVar1 != 0x25) goto LAB_0013d1d4;
      if (((9 < (byte)(((byte *)q)[1] - 0x30)) &&
          ((uVar4 = ((byte *)q)[1] - 0x41, 0x25 < uVar4 ||
           ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) ||
         ((9 < (byte)(((byte *)q)[2] - 0x30) &&
          ((uVar4 = ((byte *)q)[2] - 0x41, 0x25 < uVar4 ||
           ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) == 0)))))) {
        len_00 = 3;
        mem = (byte *)"%25";
        goto LAB_0013d1bd;
      }
      local_38._2_6_ = (uint6)(local_38 >> 0x10) & 0xffffffffff00;
      local_38 = CONCAT62(local_38._2_6_,0x25);
      cVar3 = Curl_raw_toupper(((byte *)q)[1]);
      local_38._0_2_ = CONCAT11(cVar3,(undefined1)local_38);
      cVar3 = Curl_raw_toupper(((byte *)q)[2]);
      local_38._0_3_ = CONCAT12(cVar3,(undefined2)local_38);
      CVar5 = Curl_dyn_addn(dq,&local_38,3);
      len = len - 2;
      q = (char *)((byte *)q + 2);
    }
LAB_0013d1c2:
    len = len - 1;
    if ((len == 0) || (q = (char *)((byte *)q + 1), CVar5 != CURLE_OK)) {
      return CVar5;
    }
  } while( true );
}

Assistant:

static CURLcode canon_string(const char *q, size_t len,
                             struct dynbuf *dq, bool *found_equals)
{
  CURLcode result = CURLE_OK;

  for(; len && !result; q++, len--) {
    if(ISALNUM(*q))
      result = Curl_dyn_addn(dq, q, 1);
    else {
      switch(*q) {
      case '-':
      case '.':
      case '_':
      case '~':
        /* allowed as-is */
        result = Curl_dyn_addn(dq, q, 1);
        break;
      case '%':
        /* uppercase the following if hexadecimal */
        if(ISXDIGIT(q[1]) && ISXDIGIT(q[2])) {
          char tmp[3]="%";
          tmp[1] = Curl_raw_toupper(q[1]);
          tmp[2] = Curl_raw_toupper(q[2]);
          result = Curl_dyn_addn(dq, tmp, 3);
          q += 2;
          len -= 2;
        }
        else
          /* '%' without a following two-digit hex, encode it */
          result = Curl_dyn_addn(dq, "%25", 3);
        break;
      default: {
        unsigned char out[3]={'%'};

        if(!found_equals) {
          /* if found_equals is NULL assuming, been in path */
          if(*q == '/') {
            /* allowed as if */
            result = Curl_dyn_addn(dq, q, 1);
            break;
          }
        }
        else {
          /* allowed as-is */
          if(*q == '=') {
            result = Curl_dyn_addn(dq, q, 1);
            *found_equals = TRUE;
            break;
          }
        }
        /* URL encode */
        Curl_hexbyte(&out[1], *q, FALSE);
        result = Curl_dyn_addn(dq, out, 3);
        break;
      }
      }
    }
  }
  return result;
}